

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec2 djb::brdf::u2_to_d2(vec2 *u)

{
  vec2 vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = u->x + u->x + -1.0;
  fVar3 = u->y + u->y + -1.0;
  fVar2 = 0.0;
  if ((fVar5 == 0.0) && (!NAN(fVar5))) {
    if ((fVar3 == 0.0) && (fVar4 = 0.0, !NAN(fVar3))) goto LAB_0013bcc6;
  }
  if (fVar5 * fVar5 <= fVar3 * fVar3) {
    fVar2 = (fVar5 / fVar3) * -0.7853982 + 1.5707964;
    fVar4 = fVar3;
  }
  else {
    fVar2 = (fVar3 / fVar5) * 0.7853982;
    fVar4 = fVar5;
  }
LAB_0013bcc6:
  fVar3 = cosf(fVar2);
  fVar2 = sinf(fVar2);
  vVar1.y = fVar2 * fVar4;
  vVar1.x = fVar3 * fVar4;
  return vVar1;
}

Assistant:

vec2 brdf::u2_to_d2(const vec2 &u)
{
	/* Concentric map code with less branching (by Dave Cline), see
	   http://psgraphics.blogspot.ch/2011/01/improved-code-for-concentric-map.html */
	float_t r1 = 2 * u.x - 1;
	float_t r2 = 2 * u.y - 1;
	float_t phi, r;

	if (r1 == 0 && r2 == 0) {
		r = phi = 0;
	} else if (r1 * r1 > r2 * r2) {
		r = r1;
		phi = (m_pi() / 4) * (r2 / r1);
	} else {
		r = r2;
		phi = (m_pi() / 2) - (r1 / r2) * (m_pi() / 4);
	}

	return r * vec2(cos(phi), sin(phi));
}